

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base.h
# Opt level: O0

void __thiscall
fructose::test_base<TestAdsPerformance>::add_test
          (test_base<TestAdsPerformance> *this,string *name,test_case the_test)

{
  bool bVar1;
  long lVar2;
  mapped_type *this_00;
  ostream *poVar3;
  string local_2c8 [32];
  stringstream local_2a8 [8];
  stringstream str;
  ostream local_298 [376];
  test_info local_120;
  test_info local_d8;
  pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
  local_a0;
  iterator local_58;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>
  local_50;
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>
  local_40;
  const_iterator it;
  test_case the_test_local;
  string *name_local;
  test_base<TestAdsPerformance> *this_local;
  
  it._M_node = (_Base_ptr)the_test;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
         ::find(&this->m_tests,name);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>
    ::_Rb_tree_const_iterator(&local_40,&local_48);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
         ::end(&this->m_tests);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>
    ::_Rb_tree_const_iterator(&local_50,&local_58);
    bVar1 = std::operator==(&local_40,&local_50);
    if (bVar1) {
      test_root::test_info::test_info(&local_d8,name);
      std::
      make_pair<void(TestAdsPerformance::*&)(std::__cxx11::string_const&),fructose::test_root::test_info>
                (&local_a0,(offset_in_TestAdsPerformance_to_subr *)&it,&local_d8);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
                ::operator[](&this->m_tests,name);
      std::
      pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
      ::operator=(this_00,&local_a0);
      std::
      pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
      ::~pair(&local_a0);
      test_root::test_info::~test_info(&local_d8);
      test_root::test_info::test_info(&local_120,name);
      std::vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>::
      push_back(&this->m_available_tests,&local_120);
      test_root::test_info::~test_info(&local_120);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_2a8);
      poVar3 = std::operator<<(local_298,"add_test called with test name \'");
      poVar3 = std::operator<<(poVar3,(string *)name);
      std::operator<<(poVar3,"\' which has already been added.");
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)&this->m_exceptionPending,local_2c8);
      std::__cxx11::string::~string(local_2c8);
      std::__cxx11::stringstream::~stringstream(local_2a8);
    }
  }
  return;
}

Assistant:

inline void 
test_base<test_container>::add_test(const std::string& name, 
                                    test_case the_test)
{
    if (m_exceptionPending.length() > 0)
    {
        return;
    }

    typename std::map<std::string, std::pair<test_case, test_info> >::const_iterator it = m_tests.find(name);
    if (it == m_tests.end())
    {
        m_tests[name] = std::make_pair(the_test, test_info(name));
        m_available_tests.push_back(name);
    }
    else
    {
        std::stringstream str;
        str << "add_test called with test name '" << name
            << "' which has already been added.";
        m_exceptionPending = str.str();
    }
}